

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O2

void chrono::collision::get_centroid_geometries
               (PQP_REAL *c,
               vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
               *mgeos,int firstgeo,int ngeos)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  Vector baricenter;
  double local_48;
  double dStack_40;
  double local_38;
  
  c[2] = 0.0;
  auVar4 = ZEXT816(0) << 0x40;
  lVar1 = (long)firstgeo;
  dVar5 = 0.0;
  uVar2 = (ulong)(uint)(~(ngeos >> 0x1f) & ngeos);
  *(undefined1 (*) [16])c = auVar4;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    (*(mgeos->
      super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
      )._M_impl.super__Vector_impl_data._M_start[lVar1]->_vptr_ChGeometry[6])(&local_48);
    lVar1 = lVar1 + 1;
    auVar4._0_8_ = local_48 + *c;
    auVar4._8_8_ = dStack_40 + c[1];
    *(undefined1 (*) [16])c = auVar4;
    dVar5 = local_38 + c[2];
    c[2] = dVar5;
  }
  dVar6 = (double)ngeos;
  auVar7._8_8_ = dVar6;
  auVar7._0_8_ = dVar6;
  auVar4 = vdivpd_avx(auVar4,auVar7);
  *(undefined1 (*) [16])c = auVar4;
  c[2] = dVar5 / dVar6;
  return;
}

Assistant:

void get_centroid_geometries(PQP_REAL c[3], std::vector<geometry::ChGeometry*>& mgeos, int firstgeo, int ngeos) {
    c[0] = c[1] = c[2] = 0.0;

    // get center of mass
    geometry::ChGeometry* nit;
    for (int count = 0; count < ngeos; ++count) {
        nit = mgeos[firstgeo + count];

        Vector baricenter = nit->Baricenter();

        c[0] += baricenter.x();
        c[1] += baricenter.y();
        c[2] += baricenter.z();
    }

    c[0] /= ngeos;
    c[1] /= ngeos;
    c[2] /= ngeos;
}